

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

GetCommitmentRequest * __thiscall
cfd::js::api::json::GetCommitmentRequest::GetAssetString_abi_cxx11_
          (GetCommitmentRequest *this,GetCommitmentRequest *obj)

{
  GetCommitmentRequest *obj_local;
  
  core::ConvertToString<std::__cxx11::string>((core *)this,&obj->asset_);
  return this;
}

Assistant:

static std::string GetAssetString(  // line separate
      const GetCommitmentRequest& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.asset_);
  }